

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

bool __thiscall mkvmuxer::Track::AddContentEncoding(Track *this)

{
  uint uVar1;
  ContentEncoding **ppCVar2;
  ContentEncoding **ppCVar3;
  ContentEncoding *pCVar4;
  ulong uVar5;
  
  uVar1 = this->content_encoding_entries_size_;
  ppCVar3 = (ContentEncoding **)operator_new__((ulong)(uVar1 + 1) * 8,(nothrow_t *)&std::nothrow);
  if (ppCVar3 == (ContentEncoding **)0x0) {
    return false;
  }
  pCVar4 = (ContentEncoding *)operator_new(0x38,(nothrow_t *)&std::nothrow);
  if (pCVar4 == (ContentEncoding *)0x0) {
    operator_delete__(ppCVar3);
    return false;
  }
  pCVar4->enc_algo_ = 5;
  pCVar4->enc_key_id_ = (uint8_t *)0x0;
  pCVar4->encoding_order_ = 0;
  pCVar4->encoding_scope_ = 1;
  pCVar4->encoding_type_ = 1;
  (pCVar4->enc_aes_settings_).cipher_mode_ = 1;
  pCVar4->enc_key_id_length_ = 0;
  ppCVar2 = this->content_encoding_entries_;
  if ((ulong)uVar1 == 0) {
    if (ppCVar2 == (ContentEncoding **)0x0) {
      uVar5 = 0;
      goto LAB_0011b1d0;
    }
  }
  else {
    uVar5 = 0;
    do {
      ppCVar3[uVar5] = ppCVar2[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  operator_delete__(ppCVar2);
  uVar5 = (ulong)this->content_encoding_entries_size_;
LAB_0011b1d0:
  this->content_encoding_entries_ = ppCVar3;
  ppCVar3[uVar5] = pCVar4;
  this->content_encoding_entries_size_ = uVar1 + 1;
  return true;
}

Assistant:

bool Track::AddContentEncoding() {
  const uint32_t count = content_encoding_entries_size_ + 1;

  ContentEncoding** const content_encoding_entries =
      new (std::nothrow) ContentEncoding*[count];  // NOLINT
  if (!content_encoding_entries)
    return false;

  ContentEncoding* const content_encoding =
      new (std::nothrow) ContentEncoding();  // NOLINT
  if (!content_encoding) {
    delete[] content_encoding_entries;
    return false;
  }

  for (uint32_t i = 0; i < content_encoding_entries_size_; ++i) {
    content_encoding_entries[i] = content_encoding_entries_[i];
  }

  delete[] content_encoding_entries_;

  content_encoding_entries_ = content_encoding_entries;
  content_encoding_entries_[content_encoding_entries_size_] = content_encoding;
  content_encoding_entries_size_ = count;
  return true;
}